

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

void ast::Sections::binary_hex_intel
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint32_t address;
  uint uVar9;
  ulong uVar10;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,file_name,_S_out);
  if (DAT_0013da98 != table) {
    uVar5 = 0;
    do {
      lVar1 = *(long *)(table + uVar5 * 8);
      bVar2 = false;
      if ((*(byte *)(lVar1 + 0x28) & 1) != 0) {
        uVar9 = *(uint *)(lVar1 + 0x24);
        bVar2 = true;
        if (uVar9 <= higher_address) {
          uVar4 = *(int *)(lVar1 + 0x30) + uVar9;
          bVar2 = false;
          if (lower_address < uVar4) {
            if (uVar9 <= lower_address) {
              uVar9 = lower_address;
            }
            if (higher_address <= uVar4) {
              uVar4 = higher_address;
            }
            address = uVar9 + byte_order;
            uVar10 = (ulong)(uVar4 - uVar9) / (ulong)word_size;
            do {
              uVar9 = (uint)uVar10;
              uVar8 = 0x10;
              if (uVar9 < 0x10) {
                uVar8 = uVar10;
              }
              uVar10 = (ulong)address / (ulong)word_size;
              iVar7 = (int)uVar8;
              ostream_printf((ostream *)&local_230,":%02X%04X00",uVar8,uVar10);
              iVar6 = (int)(uVar10 >> 8) + (int)uVar10 + iVar7;
              uVar4 = uVar9;
              while (uVar4 != 0) {
                bVar3 = Memory_space::read8((Memory_space *)memory,address);
                ostream_printf((ostream *)&local_230,"%02X",(ulong)bVar3);
                iVar6 = iVar6 + (uint)bVar3;
                address = address + word_size;
                uVar4 = (int)uVar8 - 1;
                uVar8 = (ulong)uVar4;
              }
              ostream_printf((ostream *)&local_230,"%02X\n",(ulong)(-iVar6 & 0xff));
              uVar10 = (ulong)(uVar9 - iVar7);
            } while (0x10 < uVar9);
            bVar2 = false;
          }
        }
      }
    } while ((!bVar2) && (uVar5 = uVar5 + 1, uVar5 < (ulong)(DAT_0013da98 - table >> 3)));
  }
  ostream_printf((ostream *)&local_230,":00000001FF\n");
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Sections::binary_hex_intel(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		for (size_t i = 0; i < table.size(); ++i) {
			Section *section = table.at(i);
			if ((section->flags & Section::LOADABLE) == 0)
				continue;
			if (higher_address < section->base_address)
				break;

			if (lower_address >= section->base_address + section->content_size)
				continue;

			auto section_lower_address = max(lower_address, section->base_address);
			auto section_higher_address = min(higher_address, section->base_address + section->content_size);

			auto address = section_lower_address + byte_order;
			auto size = (section_higher_address - section_lower_address) / word_size;

			do {
				auto rec_len = min(16U, size);
				auto load_address = address / word_size;
				uint8_t cheksum = (rec_len + load_address + (load_address >> 8));
				ostream_printf(file, ":%02X%04X00", rec_len, load_address);
				for (auto j = 0U; j < rec_len; ++j, address += word_size) {
					uint8_t b = memory.read8(address);
					ostream_printf(file, "%02X", b);
					cheksum += b;
				}
				ostream_printf(file, "%02X\n", static_cast<uint8_t >(-cheksum));
				size -= rec_len;
			} while (size > 0);
		}
		ostream_printf(file, ":00000001FF\n");
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}